

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O1

int XMLSearch_search_add_attribute
              (XMLSearch *search,SXML_CHAR *attr_name,SXML_CHAR *attr_value,int value_equal)

{
  int iVar1;
  char *__ptr;
  char *__ptr_00;
  XMLAttribute *pXVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -1;
  if ((attr_name != (SXML_CHAR *)0x0 && search != (XMLSearch *)0x0) && (*attr_name != '\0')) {
    __ptr = strdup(attr_name);
    if (attr_value == (SXML_CHAR *)0x0) {
      __ptr_00 = (char *)0x0;
    }
    else {
      __ptr_00 = strdup(attr_value);
    }
    if ((__ptr == (char *)0x0) || (__ptr_00 == (char *)0x0 && attr_value != (SXML_CHAR *)0x0)) {
      if (__ptr_00 != (char *)0x0) {
        free(__ptr_00);
      }
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
    }
    iVar1 = search->n_attributes;
    lVar4 = (long)iVar1;
    pXVar2 = (XMLAttribute *)realloc(search->attributes,(lVar4 * 8 + 8) * 3);
    if (pXVar2 == (XMLAttribute *)0x0) {
      if (__ptr_00 != (char *)0x0) {
        free(__ptr_00);
      }
      free(__ptr);
    }
    else {
      pXVar2[lVar4].name = __ptr;
      pXVar2[lVar4].value = __ptr_00;
      pXVar2[lVar4].active = value_equal;
      search->n_attributes = iVar1 + 1;
      search->attributes = pXVar2;
      iVar3 = iVar1;
    }
  }
  return iVar3;
}

Assistant:

int XMLSearch_search_add_attribute(XMLSearch* search, const SXML_CHAR* attr_name, const SXML_CHAR* attr_value, int value_equal)
{
	int i;
	XMLAttribute* pt;
	SXML_CHAR* name;
	SXML_CHAR* value;

	if (search == NULL)
		return -1;

	if (attr_name == NULL || attr_name[0] == NULC)
		return -1;

	name = sx_strdup(attr_name);
	value = (attr_value == NULL ? NULL : sx_strdup(attr_value));
	if (name == NULL || (attr_value && value == NULL)) {
		if (value != NULL)
			__free(value);
		if (name != NULL)
			__free(name);
	}

	i = search->n_attributes;
	pt = (XMLAttribute*)__realloc(search->attributes, (i + 1) * sizeof(XMLAttribute));
	if (pt == NULL) {
		if (value)
			__free(value);
		__free(name);
		return -1;
	}

	pt[i].name = name;
	pt[i].value = value;
	pt[i].active = value_equal;

	search->n_attributes = i+1;
	search->attributes = pt;

	return i;
}